

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.h
# Opt level: O0

void __thiscall
xLearn::Trainer::Initialize
          (Trainer *this,vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *reader_list,
          int epoch,Model *model,Loss *loss,Metric *metric,bool early_stop,int stop_window,
          bool quiet)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  long in_RCX;
  int in_EDX;
  long in_RDI;
  long in_R8;
  undefined8 in_R9;
  byte in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  int line;
  allocator *paVar4;
  string *in_stack_fffffffffffffc98;
  allocator *file;
  undefined8 in_stack_fffffffffffffca0;
  LogSeverity severity;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_fffffffffffffca8;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_fffffffffffffcb0;
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [32];
  Logger local_188;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  Logger local_138;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  Logger local_e8;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  Logger local_98;
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  Logger local_38;
  byte local_32;
  byte local_31;
  undefined8 local_30;
  long local_28;
  long local_20;
  int local_14;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffca0 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  local_31 = in_stack_00000008 & 1;
  local_32 = in_stack_00000018 & 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  bVar1 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::empty
                    (in_stack_fffffffffffffc20);
  if (bVar1) {
    Logger::Logger(&local_38,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
               ,&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Initialize",&local_91);
    poVar2 = Logger::Start(severity,in_stack_fffffffffffffc98,line,in_stack_fffffffffffffc88);
    poVar2 = std::operator<<(poVar2,"CHECK_NE failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x37);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"reader_list.empty()");
    poVar2 = std::operator<<(poVar2," = ");
    bVar1 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::empty
                      (in_stack_fffffffffffffc20);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    Logger::~Logger((Logger *)in_stack_fffffffffffffc20);
    abort();
  }
  if (local_14 < 1) {
    Logger::Logger(&local_98,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
               ,&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"Initialize",&local_e1);
    poVar2 = Logger::Start(severity,in_stack_fffffffffffffc98,line,in_stack_fffffffffffffc88);
    poVar2 = std::operator<<(poVar2,"CHECK_GT failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x38);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"epoch");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"0");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    Logger::~Logger((Logger *)in_stack_fffffffffffffc20);
    abort();
  }
  if (in_stack_00000010 < 1) {
    Logger::Logger(&local_e8,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
               ,&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"Initialize",&local_131);
    poVar2 = Logger::Start(severity,in_stack_fffffffffffffc98,line,in_stack_fffffffffffffc88);
    poVar2 = std::operator<<(poVar2,"CHECK_GT failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x39);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"stop_window");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_stack_00000010);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"0");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    Logger::~Logger((Logger *)in_stack_fffffffffffffc20);
    abort();
  }
  if (local_20 == 0) {
    Logger::Logger(&local_138,ERR);
    file = &local_159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
               ,file);
    paVar4 = &local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"Initialize",paVar4);
    poVar2 = Logger::Start(severity,(string *)file,(int)((ulong)paVar4 >> 0x20),
                           in_stack_fffffffffffffc88);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3a);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"model");
    std::operator<<(poVar2," == NULL \n");
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    Logger::~Logger((Logger *)in_stack_fffffffffffffc20);
    abort();
  }
  if (local_28 == 0) {
    Logger::Logger(&local_188,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
               ,&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"Initialize",&local_1d1);
    poVar2 = Logger::Start(severity,in_stack_fffffffffffffc98,line,in_stack_fffffffffffffc88);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3b);
    poVar3 = std::operator<<(poVar2,"\n");
    poVar3 = std::operator<<(poVar3,"loss");
    std::operator<<(poVar3," == NULL \n");
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    Logger::~Logger((Logger *)poVar2);
    abort();
  }
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator=
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  *(int *)(in_RDI + 0x18) = local_14;
  *(long *)(in_RDI + 0x28) = local_20;
  *(long *)(in_RDI + 0x30) = local_28;
  *(undefined8 *)(in_RDI + 0x38) = local_30;
  *(byte *)(in_RDI + 0x1c) = local_31 & 1;
  *(int *)(in_RDI + 0x20) = in_stack_00000010;
  *(byte *)(in_RDI + 0x24) = local_32 & 1;
  return;
}

Assistant:

void Initialize(std::vector<Reader*>& reader_list,
                  int epoch,
                  Model* model,
                  Loss* loss,
                  Metric* metric,
                  bool early_stop,
                  int stop_window,
                  bool quiet) {
    CHECK_NE(reader_list.empty(), true);
    CHECK_GT(epoch, 0);
    CHECK_GT(stop_window, 0);
    CHECK_NOTNULL(model);
    CHECK_NOTNULL(loss);
    // Do not check metric == nullptr
    reader_list_ = reader_list;
    epoch_ = epoch;
    model_ = model;
    loss_ = loss;
    metric_ = metric;
    early_stop_ = early_stop;
    stop_window_ = stop_window;
    quiet_ = quiet;
  }